

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

bool __thiscall cli::Parser::get<bool>(Parser *this,string *name)

{
  pointer ppCVar1;
  pointer __s2;
  size_t __n;
  CmdBase *pCVar2;
  int iVar3;
  runtime_error *prVar4;
  long *plVar5;
  long *plVar6;
  pointer ppCVar7;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppCVar7 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar7 != ppCVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      pCVar2 = *ppCVar7;
      if ((pCVar2->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_00113951:
          if (pCVar2->_vptr_CmdBase == (_func_int **)&PTR__CmdBase_00124970) {
            return (bool)*(undefined1 *)&pCVar2[1]._vptr_CmdBase;
          }
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"Invalid usage of the parameter ",name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_70 = (long *)*plVar5;
          plVar6 = plVar5 + 2;
          if (local_70 == plVar6) {
            local_60 = *plVar6;
            lStack_58 = plVar5[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar6;
          }
          local_68 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::runtime_error::runtime_error(prVar4,(string *)&local_70);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar3 = bcmp((pCVar2->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) goto LAB_00113951;
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar1);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"The parameter ",name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)&local_70);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}